

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
ProfiledNewScArray<false,Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  uint localRegisterID;
  JavascriptArray *value;
  
  if (((byte)this[0xd6] & 0x10) == 0) {
    OP_NewScArray<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
              (this,playout);
    return;
  }
  localRegisterID =
       (playout->super_OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).R0;
  value = ProfilingHelpers::ProfiledNewScArray
                    ((playout->
                     super_OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).C1,
                     *(FunctionBody **)(this + 0x88),playout->profileId);
  SetReg<unsigned_int>(this,localRegisterID,value);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledNewScArray(const unaligned OpLayoutDynamicProfile<T> * playout)
    {
        if (!Profiled && !isAutoProfiling)
        {
            OP_NewScArray(playout);
            return;
        }

        SetReg(
            playout->R0,
            ProfilingHelpers::ProfiledNewScArray(
                playout->C1,
                m_functionBody,
                playout->profileId));
    }